

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O2

ssize_t __thiscall diffusion::ShmReader::read(ShmReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t extraout_RAX;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  vector<char,_std::allocator<char>_> *this_01;
  
  this_01 = (vector<char,_std::allocator<char>_> *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((char)iVar1 != '\0') {
    std::vector<char,_std::allocator<char>_>::resize(this_01,4);
    cyclic_read(this,this_01);
    std::vector<char,_std::allocator<char>_>::resize
              (this_01,(long)*(int *)(this_01->super__Vector_base<char,_std::allocator<char>_>).
                                     _M_impl.super__Vector_impl_data._M_start);
    cyclic_read(this,this_01);
    return extraout_RAX;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ShmReader::read(std::vector<char> &buffer) {
    if (!this->can_read()) {
        throw ErrorNoData();
    }
    buffer.resize(sizeof(Size));
    this->cyclic_read(buffer); // avoid unaligned access.
    auto body_size = read_aligned_object<Size>(buffer.data());
    buffer.resize(body_size);
    this->cyclic_read(buffer);
}